

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O0

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  error_category *peVar4;
  error_category *peVar5;
  long local_b0;
  undefined1 local_80 [8];
  error_condition bn_1;
  error_code bc_1;
  std_category *pc2;
  error_condition bn;
  error_code bc;
  error_condition *condition_local;
  int code_local;
  std_category *this_local;
  
  bc.m_cat._0_4_ = (**(code **)(*(long *)this + 0x28))(this,code);
  bVar1 = std::operator==((error_condition *)&bc.m_cat,condition);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    peVar3 = std::error_condition::category(condition);
    peVar4 = (error_category *)std::_V2::generic_category();
    bVar1 = std::_V2::error_category::operator==(peVar3,peVar4);
    if (!bVar1) {
      peVar3 = std::error_condition::category(condition);
      peVar5 = generic_category();
      peVar4 = operator_cast_to_error_category_(peVar5);
      bVar1 = std::_V2::error_category::operator==(peVar3,peVar4);
      if (!bVar1) {
        peVar3 = std::error_condition::category(condition);
        if (peVar3 == (error_category *)0x0) {
          local_b0 = 0;
        }
        else {
          local_b0 = __dynamic_cast(peVar3,&std::_V2::error_category::typeinfo,&typeinfo,0);
        }
        if (local_b0 != 0) {
          error_code::error_code((error_code *)&bn_1.m_cat,code,this->pc_);
          iVar2 = std::error_condition::value(condition);
          error_condition::error_condition
                    ((error_condition *)local_80,iVar2,*(error_category **)(local_b0 + 8));
          bVar1 = system::operator==((error_code *)&bn_1.m_cat,(error_condition *)local_80);
          return bVar1;
        }
        return false;
      }
    }
    error_code::error_code((error_code *)&bn.m_cat,code,this->pc_);
    iVar2 = std::error_condition::value(condition);
    peVar5 = generic_category();
    error_condition::error_condition((error_condition *)&pc2,iVar2,peVar5);
    this_local._7_1_ = system::operator==((error_code *)&bn.m_cat,(error_condition *)&pc2);
  }
  return this_local._7_1_;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( default_error_condition( code ) == condition )
      {
        return true;
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return bc == bn;
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );

        return bc == bn;
      }
#endif
      else
      {
        return false;
      }
    }